

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O0

int erkStep_CheckNVector(N_Vector tmpl)

{
  N_Vector tmpl_local;
  int local_4;
  
  if ((((tmpl->ops->nvclone == (_func_N_Vector_N_Vector *)0x0) ||
       (tmpl->ops->nvdestroy == (_func_void_N_Vector *)0x0)) ||
      (tmpl->ops->nvlinearsum == (_func_void_realtype_N_Vector_realtype_N_Vector_N_Vector *)0x0)) ||
     (((tmpl->ops->nvconst == (_func_void_realtype_N_Vector *)0x0 ||
       (tmpl->ops->nvscale == (_func_void_realtype_N_Vector_N_Vector *)0x0)) ||
      (tmpl->ops->nvwrmsnorm == (_func_realtype_N_Vector_N_Vector *)0x0)))) {
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

booleantype erkStep_CheckNVector(N_Vector tmpl)
{
  if ( (tmpl->ops->nvclone     == NULL) ||
       (tmpl->ops->nvdestroy   == NULL) ||
       (tmpl->ops->nvlinearsum == NULL) ||
       (tmpl->ops->nvconst     == NULL) ||
       (tmpl->ops->nvscale     == NULL) ||
       (tmpl->ops->nvwrmsnorm  == NULL) )
    return(SUNFALSE);
  return(SUNTRUE);
}